

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

void strdump(char *e,char *p,wchar_t ewidth,wchar_t utf8)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  size_t sVar4;
  uint uVar5;
  byte *pbVar6;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  
  logprintf("      %*s = ",(ulong)(uint)ewidth,e);
  if (p == (char *)0x0) {
    pcVar8 = "NULL\n";
  }
  else {
    logprintf("\"");
    cVar3 = *p;
    if (cVar3 != '\0') {
      pcVar8 = p + 1;
      do {
        switch(cVar3) {
        case '\a':
          pcVar10 = "\\a";
          break;
        case '\b':
          pcVar10 = "\\b";
          break;
        default:
          if ((byte)(cVar3 - 0x20U) < 0x5f) {
            pcVar10 = "%c";
          }
          else {
            pcVar10 = "\\x%02X";
          }
          logprintf(pcVar10);
          goto LAB_001030c9;
        case '\n':
          pcVar10 = "\\n";
          break;
        case '\r':
          pcVar10 = "\\r";
        }
        logprintf(pcVar10);
LAB_001030c9:
        cVar3 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while (cVar3 != '\0');
    }
    logprintf("\"");
    sVar4 = strlen(p);
    logprintf(" (length %d)",sVar4 & 0xffffffff);
    pcVar8 = "\n";
    if (utf8 != L'\0') {
      sVar4 = strlen(p);
      logprintf(" [");
      uVar7 = 0;
      pbVar6 = (byte *)p;
      do {
        uVar12 = 0;
        if (sVar4 == 0) {
LAB_0010319a:
          uVar11 = 0;
          uVar9 = uVar12;
        }
        else {
          bVar1 = *pbVar6;
          if (bVar1 == 0) goto LAB_0010319a;
          bVar2 = _utf8_to_unicode_utf8_count[bVar1];
          uVar11 = 0xffffffff;
          uVar9 = 0;
          if (((ulong)(long)(char)bVar2 <= sVar4) && (uVar9 = uVar12, bVar2 - 1 < 4)) {
            switch((uint)bVar2) {
            case 1:
              uVar9 = bVar1 & 0x7f;
              uVar11 = 1;
              break;
            case 2:
              if ((pbVar6[1] & 0xffffffc0) == 0x80) {
                uVar9 = pbVar6[1] & 0x3f | (bVar1 & 0x1f) << 6;
                uVar11 = 2;
              }
              break;
            case 3:
              if (((((int)(char)pbVar6[1] & 0xc0U) == 0x80) && ((pbVar6[2] & 0xffffffc0) == 0x80))
                 && (uVar5 = ((int)(char)pbVar6[1] & 0x3fU) << 6 | (bVar1 & 0xf) << 0xc,
                    0x7ff < uVar5)) {
                uVar9 = pbVar6[2] & 0x3f | uVar5;
LAB_0010321d:
                bVar13 = 0x10ffff < uVar9;
                if (bVar13) {
                  uVar9 = 0;
                }
                uVar12 = (uint)(char)bVar2;
                if (bVar13) {
                  uVar12 = 0xffffffff;
                }
                uVar11 = (ulong)uVar12;
              }
              break;
            case 4:
              if ((((3 < sVar4) && (((int)(char)pbVar6[1] & 0xc0U) == 0x80)) &&
                  (((int)(char)pbVar6[2] & 0xc0U) == 0x80)) &&
                 (((pbVar6[3] & 0xffffffc0) == 0x80 &&
                  (uVar5 = ((int)(char)pbVar6[1] & 0x3fU) << 0xc | (bVar1 & 7) << 0x12,
                  0xffff < uVar5)))) {
                uVar9 = pbVar6[3] & 0x3f | ((int)(char)pbVar6[2] & 0x3fU) << 6 | uVar5;
                goto LAB_0010321d;
              }
            }
          }
        }
        if ((int)uVar11 < 1) goto LAB_001032ec;
        if (pbVar6 != (byte *)p) {
          logprintf(" ");
        }
        logprintf("%04X",(ulong)uVar9);
        pbVar6 = pbVar6 + uVar11;
        sVar4 = sVar4 - uVar11;
        uVar7 = uVar7 + 1;
      } while( true );
    }
  }
LAB_0010333e:
  logprintf(pcVar8);
  return;
LAB_001032ec:
  logprintf("]");
  logprintf(" (count %d",(ulong)uVar7);
  if ((int)uVar11 < 0) {
    logprintf(",unknown %zu bytes",sVar4);
  }
  logprintf(")");
  pcVar8 = "\n";
  goto LAB_0010333e;
}

Assistant:

static void strdump(const char *e, const char *p, int ewidth, int utf8)
{
	const char *q = p;

	logprintf("      %*s = ", ewidth, e);
	if (p == NULL) {
		logprintf("NULL\n");
		return;
	}
	logprintf("\"");
	while (*p != '\0') {
		unsigned int c = 0xff & *p++;
		switch (c) {
		case '\a': logprintf("\\a"); break;
		case '\b': logprintf("\\b"); break;
		case '\n': logprintf("\\n"); break;
		case '\r': logprintf("\\r"); break;
		default:
			if (c >= 32 && c < 127)
				logprintf("%c", (int)c);
			else
				logprintf("\\x%02X", c);
		}
	}
	logprintf("\"");
	logprintf(" (length %d)", q == NULL ? -1 : (int)strlen(q));

	/*
	 * If the current string is UTF-8, dump its code points.
	 */
	if (utf8) {
		size_t len;
		uint32_t uc;
		int n;
		int cnt = 0;

		p = q;
		len = strlen(p);
		logprintf(" [");
		while ((n = _utf8_to_unicode(&uc, p, len)) > 0) {
			if (p != q)
				logprintf(" ");
			logprintf("%04X", uc);
			p += n;
			len -= n;
			cnt++;
		}
		logprintf("]");
		logprintf(" (count %d", cnt);
		if (n < 0) {
			logprintf(",unknown %zu bytes", len);
		}
		logprintf(")");

	}
	logprintf("\n");
}